

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

void Curl_ssl_scache_remove_all(Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key)

{
  CURLcode CVar1;
  Curl_ssl_scache *scache;
  ssl_primary_config *conn_config;
  Curl_ssl_scache_peer *peer;
  Curl_ssl_scache_peer *local_30;
  
  scache = cf_ssl_scache_get(data);
  conn_config = Curl_ssl_cf_get_primary_config(cf);
  local_30 = (Curl_ssl_scache_peer *)0x0;
  if (scache != (Curl_ssl_scache *)0x0) {
    if ((data->share != (Curl_share *)0x0) && ((data->share->specifier & 0x10) != 0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_SSL_SESSION,CURL_LOCK_ACCESS_SINGLE);
    }
    CVar1 = cf_ssl_find_peer_by_key(data,scache,ssl_peer_key,conn_config,&local_30);
    if (local_30 != (Curl_ssl_scache_peer *)0x0 && CVar1 == CURLE_OK) {
      cf_ssl_scache_clear_peer(local_30);
    }
    if ((data->share != (Curl_share *)0x0) && ((data->share->specifier & 0x10) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_SSL_SESSION);
      return;
    }
  }
  return;
}

Assistant:

void Curl_ssl_scache_remove_all(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                const char *ssl_peer_key)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  CURLcode result;

  (void)cf;
  if(!scache)
    return;

  Curl_ssl_scache_lock(data);
  result = cf_ssl_find_peer_by_key(data, scache, ssl_peer_key, conn_config,
                                   &peer);
  if(!result && peer)
    cf_ssl_scache_clear_peer(peer);
  Curl_ssl_scache_unlock(data);
}